

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O0

void __thiscall LinearScan::CheckInvariants(LinearScan *this)

{
  uint uVar1;
  uint uVar2;
  Lifetime *pLVar3;
  StackSym *this_00;
  code *pcVar4;
  Lifetime **ppLVar5;
  bool bVar6;
  BOOLEAN BVar7;
  BVIndex BVar8;
  undefined4 *puVar9;
  Type_conflict pSVar10;
  Type *ppLVar11;
  StackSym *sym;
  Lifetime *lifetime_2;
  BitVector _unit_1;
  BVIndex reg;
  int i;
  Lifetime **lifetime_1;
  Iterator __iter_1;
  BitVector _unit;
  uint local_68;
  BVIndex index;
  uint floats;
  uint ints;
  Lifetime **lifetime;
  Iterator __iter;
  BVUnitT<unsigned_long> BStack_38;
  uint32 lastend;
  BitVector bv;
  LinearScan *this_local;
  
  BStack_38.word = (this->nonAllocatableRegs).word;
  __iter.current._4_4_ = 0;
  bv.word = (Type)this;
  _lifetime = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::GetIterator
                        (&this->activeLiveranges->
                          super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>);
  while( true ) {
    if (__iter.list == (SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar6) {
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    ppLVar5 = lifetime;
    pSVar10 = SListNodeBase<Memory::ArenaAllocator>::Next
                        (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    bVar6 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                      ((SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)ppLVar5,pSVar10);
    if (bVar6) break;
    SListNodeBase<Memory::ArenaAllocator>::Next
              (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    ppLVar11 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                         ((Iterator *)&lifetime);
    BVar7 = BVUnitT<unsigned_long>::Test(&stack0xffffffffffffffc8,(uint)(*ppLVar11)->reg);
    if (BVar7 != '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0x16a,"(!bv.Test(lifetime->reg))","!bv.Test(lifetime->reg)");
      if (!bVar6) {
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    BVUnitT<unsigned_long>::Set(&stack0xffffffffffffffc8,(uint)(*ppLVar11)->reg);
    if ((*(ushort *)&(*ppLVar11)->field_0x9c >> 4 & 1) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0x16c,"(!lifetime->isOpHelperSpilled)","!lifetime->isOpHelperSpilled");
      if (!bVar6) {
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    if ((*(ushort *)&(*ppLVar11)->field_0x9c & 1) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0x16d,"(!lifetime->isSpilled)","!lifetime->isSpilled");
      if (!bVar6) {
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    if ((*ppLVar11)->end < __iter.current._4_4_) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0x16e,"(lifetime->end >= lastend)","lifetime->end >= lastend");
      if (!bVar6) {
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    __iter.current._4_4_ = (*ppLVar11)->end;
  }
  bVar6 = BVUnitT<unsigned_long>::Equal
                    (&stack0xffffffffffffffc8,(BVUnitT<unsigned_long>)(this->activeRegs).word);
  if (!bVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x174,"(bv.Equal(this->activeRegs))","bv.Equal(this->activeRegs)");
    if (!bVar6) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  index = 0;
  local_68 = 0;
  __iter_1.current = (NodeBase *)(this->activeRegs).word;
  _unit.word._4_4_ = BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&__iter_1.current)
  ;
  while (_unit.word._4_4_ != 0xffffffff) {
    BVUnitT<unsigned_long>::Clear((BVUnitT<unsigned_long> *)&__iter_1.current,_unit.word._4_4_);
    bVar6 = IRType_IsFloat(RegTypes[_unit.word._4_4_]);
    if (bVar6) {
      local_68 = local_68 + 1;
    }
    else {
      index = index + 1;
    }
    _unit.word._4_4_ =
         BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&__iter_1.current);
  }
  if (index != this->intRegUsedCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x183,"(ints == this->intRegUsedCount)","ints == this->intRegUsedCount");
    if (!bVar6) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  if (local_68 != this->floatRegUsedCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x184,"(floats == this->floatRegUsedCount)",
                       "floats == this->floatRegUsedCount");
    if (!bVar6) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  uVar1 = this->intRegUsedCount;
  uVar2 = this->floatRegUsedCount;
  BVar8 = BVUnitT<unsigned_long>::Count(&this->activeRegs);
  if (uVar1 + uVar2 != BVar8) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x185,
                       "((this->intRegUsedCount + this->floatRegUsedCount) == this->activeRegs.Count())"
                       ,
                       "(this->intRegUsedCount + this->floatRegUsedCount) == this->activeRegs.Count()"
                      );
    if (!bVar6) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  BVUnitT<unsigned_long>::ClearAll(&stack0xffffffffffffffc8);
  __iter.current._4_4_ = 0;
  _lifetime_1 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::GetIterator
                          (&this->opHelperSpilledLiveranges->
                            super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>);
  while( true ) {
    if (__iter_1.list == (SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar6) {
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    ppLVar5 = lifetime_1;
    pSVar10 = SListNodeBase<Memory::ArenaAllocator>::Next
                        (&(__iter_1.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    bVar6 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                      ((SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)ppLVar5,pSVar10);
    if (bVar6) break;
    SListNodeBase<Memory::ArenaAllocator>::Next
              (&(__iter_1.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    ppLVar11 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                         ((Iterator *)&lifetime_1);
    BVar7 = BVUnitT<unsigned_long>::Test(&stack0xffffffffffffffc8,(uint)(*ppLVar11)->reg);
    if (BVar7 != '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0x18d,"(!bv.Test(lifetime->reg))","!bv.Test(lifetime->reg)");
      if (!bVar6) {
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    if ((*(ushort *)&(*ppLVar11)->field_0x9c >> 6 & 1) == 0) {
      BVUnitT<unsigned_long>::Set(&stack0xffffffffffffffc8,(uint)(*ppLVar11)->reg);
      if ((*(ushort *)&(*ppLVar11)->field_0x9c >> 4 & 1) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x191,"(lifetime->isOpHelperSpilled)","lifetime->isOpHelperSpilled");
        if (!bVar6) {
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      if ((*(ushort *)&(*ppLVar11)->field_0x9c & 1) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x192,"(!lifetime->isSpilled)","!lifetime->isSpilled");
        if (!bVar6) {
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
    }
    if ((*ppLVar11)->end < __iter.current._4_4_) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0x194,"(lifetime->end >= lastend)","lifetime->end >= lastend");
      if (!bVar6) {
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    __iter.current._4_4_ = (*ppLVar11)->end;
  }
  bVar6 = BVUnitT<unsigned_long>::Equal
                    (&stack0xffffffffffffffc8,
                     (BVUnitT<unsigned_long>)(this->opHelperSpilledRegs).word);
  if (!bVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x19a,"(bv.Equal(this->opHelperSpilledRegs))",
                       "bv.Equal(this->opHelperSpilledRegs)");
    if (!bVar6) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  _unit_1.word._4_4_ = 0;
  do {
    if (0x20 < (int)_unit_1.word._4_4_) {
      lifetime_2 = (Lifetime *)(this->secondChanceRegs).word;
      _unit_1.word._0_4_ = BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&lifetime_2)
      ;
      do {
        if ((BVIndex)_unit_1.word == 0xffffffff) {
          return;
        }
        BVUnitT<unsigned_long>::Clear((BVUnitT<unsigned_long> *)&lifetime_2,(BVIndex)_unit_1.word);
        pLVar3 = this->regContent[(BVIndex)_unit_1.word];
        if (pLVar3 == (Lifetime *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                             ,0x1a7,"(lifetime)","lifetime");
          if (!bVar6) {
            pcVar4 = (code *)invalidInstructionException();
            (*pcVar4)();
          }
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 0;
        }
        this_00 = pLVar3->sym;
        if ((*(ushort *)&pLVar3->field_0x9c >> 9 & 1) == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                             ,0x1a9,"(lifetime->isSecondChanceAllocated)",
                             "lifetime->isSecondChanceAllocated");
          if (!bVar6) {
            pcVar4 = (code *)invalidInstructionException();
            (*pcVar4)();
          }
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 0;
        }
        bVar6 = StackSym::IsConst(this_00);
        if ((!bVar6) && (bVar6 = StackSym::IsAllocated(this_00), !bVar6)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                             ,0x1aa,"(sym->IsConst() || sym->IsAllocated())",
                             "sym->IsConst() || sym->IsAllocated()");
          if (!bVar6) {
            pcVar4 = (code *)invalidInstructionException();
            (*pcVar4)();
          }
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 0;
        }
        _unit_1.word._0_4_ =
             BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&lifetime_2);
      } while( true );
    }
    BVar7 = BVUnitT<unsigned_long>::Test(&this->tempRegs,_unit_1.word._4_4_);
    if ((BVar7 != '\0') &&
       (this->tempRegLifetimes[(int)_unit_1.word._4_4_]->reg != _unit_1.word._4_4_)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0x1a0,"(this->tempRegLifetimes[i]->reg == i)",
                         "this->tempRegLifetimes[i]->reg == i");
      if (!bVar6) {
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    _unit_1.word._4_4_ = _unit_1.word._4_4_ + 1;
  } while( true );
}

Assistant:

void
LinearScan::CheckInvariants() const
{
    BitVector bv = this->nonAllocatableRegs;
    uint32 lastend = 0;
    FOREACH_SLIST_ENTRY(Lifetime *, lifetime, this->activeLiveranges)
    {
        // Make sure there are only one lifetime per reg
        Assert(!bv.Test(lifetime->reg));
        bv.Set(lifetime->reg);
        Assert(!lifetime->isOpHelperSpilled);
        Assert(!lifetime->isSpilled);
        Assert(lifetime->end >= lastend);
        lastend = lifetime->end;
    }
    NEXT_SLIST_ENTRY;

    // Make sure the active reg bit vector is correct
    Assert(bv.Equal(this->activeRegs));

    uint ints = 0, floats = 0;
    FOREACH_BITSET_IN_UNITBV(index, this->activeRegs, BitVector)
    {
        if (IRType_IsFloat(RegTypes[index]))
        {
            floats++;
        }
        else
        {
            ints++;
        }
    }
    NEXT_BITSET_IN_UNITBV;
    Assert(ints == this->intRegUsedCount);
    Assert(floats == this->floatRegUsedCount);
    Assert((this->intRegUsedCount + this->floatRegUsedCount) == this->activeRegs.Count());

    bv.ClearAll();

    lastend = 0;
    FOREACH_SLIST_ENTRY(Lifetime *, lifetime, this->opHelperSpilledLiveranges)
    {
        // Make sure there are only one lifetime per reg in the op helper spilled liveranges
        Assert(!bv.Test(lifetime->reg));
        if (!lifetime->cantOpHelperSpill)
        {
            bv.Set(lifetime->reg);
            Assert(lifetime->isOpHelperSpilled);
            Assert(!lifetime->isSpilled);
        }
        Assert(lifetime->end >= lastend);
        lastend = lifetime->end;
    }
    NEXT_SLIST_ENTRY;

    // Make sure the opHelperSpilledRegs bit vector is correct
    Assert(bv.Equal(this->opHelperSpilledRegs));

    for (int i = 0; i < RegNumCount; i++)
    {
        if (this->tempRegs.Test(i))
        {
            Assert(this->tempRegLifetimes[i]->reg == i);
        }
    }

    FOREACH_BITSET_IN_UNITBV(reg, this->secondChanceRegs, BitVector)
    {
        Lifetime *lifetime = this->regContent[reg];
        Assert(lifetime);
        StackSym *sym = lifetime->sym;
        Assert(lifetime->isSecondChanceAllocated);
        Assert(sym->IsConst() || sym->IsAllocated());  // Should have been spilled already.
    } NEXT_BITSET_IN_UNITBV;

}